

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

void cfd::core::ConfidentialValue::CheckVersion(uint8_t version)

{
  CfdException *this;
  byte in_DIL;
  uchar local_41;
  undefined1 local_40 [32];
  
  if ((in_DIL & 0xf6) == 0) {
    return;
  }
  local_40._0_8_ = "cfdcore_elements_transaction.cpp";
  local_40._8_4_ = 0x252;
  local_40._16_8_ = "CheckVersion";
  logger::log<unsigned_char&>
            ((CfdSourceLocation *)local_40,kCfdLogLevelWarning,"Value version Invalid. version={}.",
             &local_41);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._0_8_ = local_40 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Value version Invalid.","");
  CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_40);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void ConfidentialValue::CheckVersion(uint8_t version) {
  if ((version != 0) && (version != 1) && (version != 0x08) &&
      (version != 0x09)) {
    warn(CFD_LOG_SOURCE, "Value version Invalid. version={}.", version);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Value version Invalid.");
  }
}